

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROMHeader.cpp
# Opt level: O3

ROMAddress * __thiscall SNESROMHeader::getInterruptDest(SNESROMHeader *this,EmulationIV vector)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  ROMAddress *this_00;
  
  puVar3 = this->m_HeaderData;
  uVar1 = puVar3[vector.idx * 2 + 0x35];
  uVar2 = puVar3[vector.idx * 2 + 0x34];
  this_00 = getROMAddressObject((RomLayout)(puVar3[0x15] & 1));
  ROMAddress::setROMAddress(this_00,(uint)CONCAT11(uVar1,uVar2));
  return this_00;
}

Assistant:

ROMAddress* SNESROMHeader::getInterruptDest(EmulationIV vector) const {
    uint16_t addr = (m_HeaderData[m_EmulationInterruptVectorIndex + 2*static_cast<unsigned int>(vector) + 1] << 8)
                  | m_HeaderData[m_EmulationInterruptVectorIndex + 2*static_cast<unsigned int>(vector)];

    ROMAddress* result = getROMAddressObject(layout());
    result->setROMAddress(addr);
    return result;
}